

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::update
          (TypedTimeSamples<tinyusdz::value::normal3f> *this)

{
  std::
  __sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample*,std::vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::update()const::_lambda(tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample_const&,tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample_const&)_1_>>
            ((this->_samples).
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->_samples).
             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }